

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

void __thiscall
wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
          (RefPtr<wabt::interp::Func> *this,Store *store,Ref ref)

{
  FILE *__stream;
  bool bVar1;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar2;
  pointer this_00;
  char *pcVar3;
  char *pcVar4;
  Index IVar5;
  Func *pFVar6;
  ObjectKind local_2c;
  ObjectKind ref_kind;
  Store *store_local;
  RefPtr<wabt::interp::Func> *this_local;
  Ref ref_local;
  
  bVar1 = Store::Is<wabt::interp::Func>(store,ref);
  if (!bVar1) {
    bVar1 = interp::operator==(ref,Ref::Null);
    if (bVar1) {
      local_2c = Null;
    }
    else {
      puVar2 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
               ::Get(&store->objects_,ref.index);
      this_00 = std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>::
                operator->(puVar2);
      local_2c = Object::kind(this_00);
    }
    __stream = _stderr;
    pcVar3 = GetName(local_2c);
    pcVar4 = Extern::GetTypeName();
    fprintf(__stream,"Invalid conversion from Ref (%s) to RefPtr<%s>!\n",pcVar3,pcVar4);
    abort();
  }
  IVar5 = Store::NewRoot(store,ref);
  this->root_index_ = IVar5;
  puVar2 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
           ::Get(&store->objects_,ref.index);
  pFVar6 = (Func *)std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                   ::get(puVar2);
  this->obj_ = pFVar6;
  this->store_ = store;
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}